

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O3

sc_unsigned * __thiscall sc_dt::sc_unsigned::operator=(sc_unsigned *this,long v)

{
  int iVar1;
  sc_digit *psVar2;
  ulong uVar3;
  small_type sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar4 = 1;
  uVar6 = v;
  if (v < 1) {
    if (v == 0) {
      this->sgn = 0;
      if (this->ndigits < 1) {
        return this;
      }
      memset(this->digit,0,(ulong)(this->ndigits - 1) * 4 + 4);
      return this;
    }
    uVar6 = -v;
    if ((ulong)v < 0x8000000000000001) {
      uVar6 = 0x8000000000000000;
    }
    sVar4 = -1;
  }
  this->sgn = sVar4;
  iVar1 = this->ndigits;
  uVar5 = (ulong)iVar1;
  if (0 < (long)uVar5) {
    psVar2 = this->digit;
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      psVar2[uVar7 - 1] = (uint)uVar6 & 0x3fffffff;
      if (uVar6 < 0x40000000) break;
      uVar6 = uVar6 >> 0x1e;
      uVar3 = uVar7 + 1;
    } while (uVar7 < uVar5);
    if (uVar7 < uVar5) {
      memset(psVar2 + uVar7,0,(ulong)(uint)(iVar1 - (int)(uVar7 + 1)) * 4 + 4);
    }
  }
  convert_SM_to_2C_to_SM(this);
  return this;
}

Assistant:

const sc_unsigned&
sc_unsigned::operator=(long v)
{
  sgn = get_sign(v);
  if ( sgn == SC_ZERO ) {
    vec_zero(ndigits, digit);
  }
  else {
    from_uint(ndigits, digit, (unsigned long) v);
    convert_SM_to_2C_to_SM();
  }
  return *this;
}